

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O3

h2o_hostconf_t *
find_hostconf(h2o_hostconf_t **hostconfs,h2o_iovec_t authority,uint16_t default_port)

{
  char cVar1;
  long lVar2;
  short sVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  undefined6 in_register_0000000a;
  char cVar7;
  char *__n;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  char *test;
  h2o_hostconf_t *phVar11;
  h2o_hostconf_t **pphVar12;
  undefined8 uStack_70;
  char acStack_68 [8];
  undefined1 local_60 [8];
  h2o_iovec_t hostname;
  ushort local_36;
  uint local_34;
  uint16_t port;
  
  if (authority.len < 0x10000) {
    local_34 = (uint)CONCAT62(in_register_0000000a,default_port);
    uStack_70 = 0x13b08a;
    pcVar5 = h2o_url_parse_hostport(authority.base,authority.len,(h2o_iovec_t *)local_60,&local_36);
    if (pcVar5 != (char *)0x0) {
      uVar8 = (uint)local_36;
      if (local_36 == 0xffff) {
        local_36 = (ushort)local_34;
        uVar8 = local_34;
      }
      lVar2 = -((ulong)(hostname.base + 0xf) & 0xfffffffffffffff0);
      pcVar5 = acStack_68 + lVar2;
      *(undefined8 *)((long)&uStack_70 + lVar2) = 0x13b0c8;
      memcpy(pcVar5,(void *)local_60,(size_t)hostname.base);
      if (hostname.base != (char *)0x0) {
        pcVar6 = (char *)0x0;
        do {
          cVar1 = pcVar5[(long)pcVar6];
          cVar7 = cVar1 + ' ';
          if (0x19 < (int)cVar1 - 0x41U) {
            cVar7 = cVar1;
          }
          pcVar5[(long)pcVar6] = cVar7;
          pcVar6 = pcVar6 + 1;
        } while (hostname.base != pcVar6);
      }
      hostname.len = (size_t)(pcVar5 + (long)hostname.base);
      phVar11 = *hostconfs;
      pphVar12 = hostconfs + 1;
      uVar9 = local_34 ^ uVar8;
      local_34 = uVar9;
      do {
        sVar3 = (short)*(undefined4 *)&(phVar11->authority).port;
        if ((sVar3 == (short)uVar8) || (sVar3 == -1 && (short)uVar9 == 0)) {
          pcVar6 = (phVar11->authority).host.base;
          pcVar10 = (char *)(phVar11->authority).host.len;
          cVar1 = *pcVar6;
          if (cVar1 == '*') {
            if (pcVar10 + -1 < hostname.base) {
              __n = pcVar10 + -1;
              pcVar10 = (char *)((hostname.len - (long)pcVar10) + 1);
LAB_0013b171:
              *(undefined8 *)((long)&uStack_70 + lVar2) = 0x13b176;
              iVar4 = bcmp(pcVar6 + 1,pcVar10,(size_t)__n);
              uVar9 = local_34;
              if (iVar4 == 0) {
                return phVar11;
              }
            }
          }
          else if (pcVar10 == hostname.base) {
            if (hostname.base == (char *)0x0) {
              return phVar11;
            }
            __n = hostname.base + -1;
            pcVar10 = acStack_68 + lVar2 + 1;
            if (cVar1 == *pcVar5) goto LAB_0013b171;
          }
        }
        phVar11 = *pphVar12;
        pphVar12 = pphVar12 + 1;
      } while (phVar11 != (h2o_hostconf_t *)0x0);
    }
  }
  return (h2o_hostconf_t *)0x0;
}

Assistant:

static h2o_hostconf_t *find_hostconf(h2o_hostconf_t **hostconfs, h2o_iovec_t authority, uint16_t default_port)
{
    h2o_iovec_t hostname;
    uint16_t port;
    char *hostname_lc;

    /* safe-guard for alloca */
    if (authority.len >= 65536)
        return NULL;

    /* extract the specified hostname and port */
    if (h2o_url_parse_hostport(authority.base, authority.len, &hostname, &port) == NULL)
        return NULL;
    if (port == 65535)
        port = default_port;

    /* convert supplied hostname to lower-case */
    hostname_lc = alloca(hostname.len);
    memcpy(hostname_lc, hostname.base, hostname.len);
    h2o_strtolower(hostname_lc, hostname.len);

    do {
        h2o_hostconf_t *hostconf = *hostconfs;
        if (hostconf->authority.port == port || (hostconf->authority.port == 65535 && port == default_port)) {
            if (hostconf->authority.host.base[0] == '*') {
                /* matching against "*.foo.bar" */
                size_t cmplen = hostconf->authority.host.len - 1;
                if (cmplen < hostname.len &&
                    memcmp(hostconf->authority.host.base + 1, hostname_lc + hostname.len - cmplen, cmplen) == 0)
                    return hostconf;
            } else {
                /* exact match */
                if (h2o_memis(hostconf->authority.host.base, hostconf->authority.host.len, hostname_lc, hostname.len))
                    return hostconf;
            }
        }
    } while (*++hostconfs != NULL);

    return NULL;
}